

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O2

void post_process_prepass
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
               JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  int *piVar1;
  jpeg_d_post_controller *pjVar2;
  uint uVar3;
  JSAMPARRAY ppJVar4;
  int iVar5;
  uint uVar6;
  
  pjVar2 = cinfo->post;
  uVar6 = *(uint *)&pjVar2[2].post_process_data;
  if (uVar6 == 0) {
    ppJVar4 = (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)pjVar2[1].start_pass,
                         *(JDIMENSION *)((long)&pjVar2[2].start_pass + 4),
                         *(JDIMENSION *)&pjVar2[2].start_pass,1);
    pjVar2[1].post_process_data =
         (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
          *)ppJVar4;
    uVar6 = *(uint *)&pjVar2[2].post_process_data;
  }
  else {
    ppJVar4 = (JSAMPARRAY)pjVar2[1].post_process_data;
  }
  (*cinfo->upsample->upsample)
            (cinfo,input_buf,in_row_group_ctr,in_row_groups_avail,ppJVar4,
             (JDIMENSION *)&pjVar2[2].post_process_data,*(JDIMENSION *)&pjVar2[2].start_pass);
  uVar3 = *(uint *)&pjVar2[2].post_process_data;
  iVar5 = uVar3 - uVar6;
  if (uVar6 <= uVar3 && iVar5 != 0) {
    (*cinfo->cquantize->color_quantize)
              (cinfo,(JSAMPARRAY)(pjVar2[1].post_process_data + (ulong)uVar6 * 8),(JSAMPARRAY)0x0,
               iVar5);
    *out_row_ctr = *out_row_ctr + iVar5;
    uVar3 = *(uint *)&pjVar2[2].post_process_data;
  }
  if (*(uint *)&pjVar2[2].start_pass <= uVar3) {
    piVar1 = (int *)((long)&pjVar2[2].start_pass + 4);
    *piVar1 = *piVar1 + *(uint *)&pjVar2[2].start_pass;
    *(undefined4 *)&pjVar2[2].post_process_data = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
post_process_prepass (j_decompress_ptr cinfo,
		      JSAMPIMAGE input_buf, JDIMENSION *in_row_group_ctr,
		      JDIMENSION in_row_groups_avail,
		      JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
		      JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr) cinfo->post;
  JDIMENSION old_next_row, num_rows;

  /* Reposition virtual buffer if at start of strip. */
  if (post->next_row == 0) {
    post->buffer = (*cinfo->mem->access_virt_sarray)
	((j_common_ptr) cinfo, post->whole_image,
	 post->starting_row, post->strip_height, TRUE);
  }

  /* Upsample some data (up to a strip height's worth). */
  old_next_row = post->next_row;
  (*cinfo->upsample->upsample) (cinfo,
		input_buf, in_row_group_ctr, in_row_groups_avail,
		post->buffer, &post->next_row, post->strip_height);

  /* Allow quantizer to scan new data.  No data is emitted, */
  /* but we advance out_row_ctr so outer loop can tell when we're done. */
  if (post->next_row > old_next_row) {
    num_rows = post->next_row - old_next_row;
    (*cinfo->cquantize->color_quantize) (cinfo, post->buffer + old_next_row,
					 (JSAMPARRAY) NULL, (int) num_rows);
    *out_row_ctr += num_rows;
  }

  /* Advance if we filled the strip. */
  if (post->next_row >= post->strip_height) {
    post->starting_row += post->strip_height;
    post->next_row = 0;
  }
}